

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

SQInteger __thiscall SQFuncState::AllocStackPos(SQFuncState *this)

{
  SQUnsignedInteger SVar1;
  ulong uVar2;
  SQLocalVarInfo local_38;
  
  SVar1 = (this->_vlocals)._size;
  local_38._name.super_SQObject._type = OT_NULL;
  local_38._name.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_38._start_op = 0;
  local_38._end_op = 0;
  local_38._pos = 0;
  sqvector<SQLocalVarInfo>::push_back(&this->_vlocals,&local_38);
  SQObjectPtr::~SQObjectPtr(&local_38._name);
  uVar2 = (this->_vlocals)._size;
  if ((ulong)this->_stacksize < uVar2) {
    if (0xff < this->_stacksize) {
      (*this->_errfunc)(this->_errtarget,"internal compiler error: too many locals");
      uVar2 = (this->_vlocals)._size;
    }
    this->_stacksize = uVar2;
  }
  return SVar1;
}

Assistant:

SQInteger SQFuncState::AllocStackPos()
{
    SQInteger npos=_vlocals.size();
    _vlocals.push_back(SQLocalVarInfo());
    if(_vlocals.size()>((SQUnsignedInteger)_stacksize)) {
        if(_stacksize>MAX_FUNC_STACKSIZE) Error(_SC("internal compiler error: too many locals"));
        _stacksize=_vlocals.size();
    }
    return npos;
}